

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  CommentInfo *pCVar1;
  char *pcVar2;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  undefined8 *puVar3;
  CommentInfo *pCVar4;
  size_t len_00;
  uint uVar5;
  CommentInfo *local_60;
  CommentInfo *otherComment;
  int comment;
  char *local_28;
  char *str;
  Value *pVStack_18;
  uint len;
  Value *other_local;
  Value *this_local;
  
  this->field_0x8 = other->field_0x8;
  this->field_0x9 = this->field_0x9 & 0xfe;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = other->start_;
  this->limit_ = other->limit_;
  uVar5 = (uint)(ushort)(byte)this->field_0x8;
  pVStack_18 = other;
  other_local = this;
  if (3 < (byte)this->field_0x8) {
    if (uVar5 == 4) {
      if (((other->value_).int_ == 0) || ((*(ushort *)&other->field_0x8 >> 8 & 1) == 0)) {
        this->value_ = other->value_;
        *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xfeff;
      }
      else {
        decodePrefixedString
                  ((*(ushort *)&other->field_0x8 >> 8 & 1) != 0,(other->value_).string_,
                   (uint *)((long)&str + 4),&local_28);
        pcVar2 = duplicateAndPrefixStringValue(local_28,str._4_4_);
        (this->value_).string_ = pcVar2;
        *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xfeff | 0x100;
      }
      goto LAB_0016b0b3;
    }
    if (uVar5 != 5) {
      if (1 < uVar5 - 6) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/IcicleF[P]ai9_logic_2018/src/jsoncpp.cpp"
                      ,0xb64,"Json::Value::Value(const Value &)");
      }
      this_00 = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 *)operator_new(0x30);
      std::
      map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::map(this_00,(pVStack_18->value_).map_);
      (this->value_).map_ = this_00;
      goto LAB_0016b0b3;
    }
  }
  this->value_ = other->value_;
LAB_0016b0b3:
  if (pVStack_18->comments_ != (CommentInfo *)0x0) {
    puVar3 = (undefined8 *)operator_new__(0x20);
    *puVar3 = 3;
    local_60 = (CommentInfo *)(puVar3 + 1);
    do {
      CommentInfo::CommentInfo(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != (CommentInfo *)(puVar3 + 4));
    this->comments_ = (CommentInfo *)(puVar3 + 1);
    for (otherComment._0_4_ = 0; (int)otherComment < 3; otherComment._0_4_ = (int)otherComment + 1)
    {
      pCVar4 = pVStack_18->comments_ + (int)otherComment;
      if (pCVar4->comment_ != (char *)0x0) {
        pCVar1 = this->comments_;
        pcVar2 = pCVar4->comment_;
        len_00 = strlen(pCVar4->comment_);
        CommentInfo::setComment(pCVar1 + (int)otherComment,pcVar2,len_00);
      }
    }
  }
  return;
}

Assistant:

Value::Value(Value const& other)
    : type_(other.type_), allocated_(false)
      ,
      comments_(0), start_(other.start_), limit_(other.limit_)
{
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    value_ = other.value_;
    break;
  case stringValue:
    if (other.value_.string_ && other.allocated_) {
      unsigned len;
      char const* str;
      decodePrefixedString(other.allocated_, other.value_.string_,
          &len, &str);
      value_.string_ = duplicateAndPrefixStringValue(str, len);
      allocated_ = true;
    } else {
      value_.string_ = other.value_.string_;
      allocated_ = false;
    }
    break;
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues(*other.value_.map_);
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  if (other.comments_) {
    comments_ = new CommentInfo[numberOfCommentPlacement];
    for (int comment = 0; comment < numberOfCommentPlacement; ++comment) {
      const CommentInfo& otherComment = other.comments_[comment];
      if (otherComment.comment_)
        comments_[comment].setComment(
            otherComment.comment_, strlen(otherComment.comment_));
    }
  }
}